

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cangen.c
# Opt level: O0

timespec timespec_normalise(timespec ts)

{
  timespec tVar1;
  timespec ts_local;
  
  ts_local.tv_sec = ts.tv_sec;
  for (ts_local.tv_nsec = ts.tv_nsec; 999999999 < ts_local.tv_nsec;
      ts_local.tv_nsec = ts_local.tv_nsec + -1000000000) {
    ts_local.tv_sec = ts_local.tv_sec + 1;
  }
  for (; ts_local.tv_nsec < -999999999; ts_local.tv_nsec = ts_local.tv_nsec + 1000000000) {
    ts_local.tv_sec = ts_local.tv_sec + -1;
  }
  if (ts_local.tv_nsec < 0) {
    ts_local.tv_sec = ts_local.tv_sec + -1;
    ts_local.tv_nsec = ts_local.tv_nsec + 1000000000;
  }
  tVar1.tv_nsec = ts_local.tv_nsec;
  tVar1.tv_sec = ts_local.tv_sec;
  return tVar1;
}

Assistant:

static struct timespec timespec_normalise(struct timespec ts)
{
	while (ts.tv_nsec >= NSEC_PER_SEC) {
		++(ts.tv_sec);
		ts.tv_nsec -= NSEC_PER_SEC;
	}

	while (ts.tv_nsec <= -NSEC_PER_SEC) {
		--(ts.tv_sec);
		ts.tv_nsec += NSEC_PER_SEC;
	}

	if (ts.tv_nsec < 0) {
		/*
		 * Negative nanoseconds isn't valid according to
		 * POSIX. Decrement tv_sec and roll tv_nsec over.
		 */

		--(ts.tv_sec);
		ts.tv_nsec = (NSEC_PER_SEC + ts.tv_nsec);
	}

	return ts;
}